

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O3

bool __thiscall
capnp::anon_unknown_1::CapnpcCppMain::TemplateContext::hasParams(TemplateContext *this)

{
  bool bVar1;
  PointerReader local_58;
  ListReader local_38;
  
  bVar1 = (this->node)._reader.pointerCount < 6;
  local_58.pointer = (this->node)._reader.pointers + 5;
  if (bVar1) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = (this->node)._reader.nestingLimit;
  if (bVar1) {
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
    local_58.nestingLimit = 0x7fffffff;
  }
  else {
    local_58.segment._0_4_ = *(undefined4 *)&(this->node)._reader.segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(this->node)._reader.segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(this->node)._reader.capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(this->node)._reader.capTable + 4);
  }
  _::PointerReader::getList(&local_38,&local_58,INLINE_COMPOSITE,(word *)0x0);
  return local_38.elementCount != 0;
}

Assistant:

inline PointerReader StructReader::getPointerField(StructPointerOffset ptrIndex) const {
  if (ptrIndex < pointerCount) {
    // Hacky because WirePointer is defined in the .c++ file (so is incomplete here).
    return PointerReader(segment, capTable, reinterpret_cast<const WirePointer*>(
        reinterpret_cast<const word*>(pointers) + ptrIndex * WORDS_PER_POINTER), nestingLimit);
  } else{
    return PointerReader();
  }
}